

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CordOutputStream::CordOutputStream
          (CordOutputStream *this,Cord *cord,size_t size_hint)

{
  bool bVar1;
  size_t size_hint_local;
  Cord *cord_local;
  CordOutputStream *this_local;
  
  ZeroCopyOutputStream::ZeroCopyOutputStream(&this->super_ZeroCopyOutputStream);
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__CordOutputStream_008a99f8;
  absl::lts_20240722::Cord::Cord(&this->cord_,cord);
  this->size_hint_ = size_hint;
  bVar1 = absl::lts_20240722::Cord::empty(&this->cord_);
  this->state_ = ((byte)~bVar1 & 1) * 3;
  absl::lts_20240722::CordBuffer::CordBuffer(&this->buffer_);
  return;
}

Assistant:

CordOutputStream::CordOutputStream(absl::Cord cord, size_t size_hint)
    : cord_(std::move(cord)),
      size_hint_(size_hint),
      state_(cord_.empty() ? State::kEmpty : State::kSteal) {}